

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

void secp256k1_context_destroy(secp256k1_context *ctx)

{
  if (ctx != (secp256k1_context *)0x0) {
    if ((ctx->ecmult_gen_ctx).built != 0) {
      free(ctx);
      return;
    }
    secp256k1_context_destroy_cold_1();
  }
  return;
}

Assistant:

void secp256k1_context_destroy(secp256k1_context* ctx) {
    ARG_CHECK_VOID(ctx == NULL || secp256k1_context_is_proper(ctx));

    /* Defined as noop */
    if (ctx == NULL) {
        return;
    }

    secp256k1_context_preallocated_destroy(ctx);
    free(ctx);
}